

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall
pbrt::RealisticCamera::DrawRayPathFromFilm
          (RealisticCamera *this,Ray *r,bool arrow,bool toOpticalIntercept)

{
  uint uVar1;
  float fVar2;
  LensElementInterface *pLVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uint uVar7;
  char cVar8;
  char *pcVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_var [60];
  undefined1 auVar18 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  double dVar19;
  undefined1 auVar20 [16];
  Point3f PVar21;
  Vector3<float> VVar22;
  Point3f PVar23;
  Float t;
  undefined4 local_cc;
  undefined1 local_c8 [16];
  Float va;
  float fStack_ac;
  float local_a8;
  double local_a0;
  double local_98;
  undefined4 local_90;
  float local_8c;
  int vb;
  float local_80;
  Ray local_78;
  Tuple3<pbrt::Normal3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  
  local_90 = (undefined4)CONCAT71(in_register_00000009,toOpticalIntercept);
  local_cc = (undefined4)CONCAT71(in_register_00000011,arrow);
  if ((DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera == '\0') &&
     (iVar6 = __cxa_guard_acquire(&DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera),
     iVar6 != 0)) {
    Scale(&DrawRayPathFromFilm::LensFromCamera,1.0,1.0,-1.0);
    __cxa_guard_release(&DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera);
  }
  Transform::operator()(&local_78,&DrawRayPathFromFilm::LensFromCamera,r,(Float *)0x0);
  printf("{ ");
  auVar16._0_4_ = TraceLensesFromFilm(this,r,(Ray *)0x0);
  auVar16._4_60_ = extraout_var;
  pcVar9 = "Dashed, RGBColor[.8, .5, .5]";
  if (auVar16._0_4_ != 0.0) {
    pcVar9 = "RGBColor[.5, .5, .8]";
  }
  if (NAN(auVar16._0_4_)) {
    pcVar9 = "RGBColor[.5, .5, .8]";
  }
  printf(pcVar9);
  uVar7 = (uint)(this->elementInterfaces).nStored;
  fVar12 = 0.0;
  while( true ) {
    auVar18 = auVar16._8_56_;
    uVar1 = uVar7 - 1;
    if ((int)uVar1 < 0) break;
    pLVar3 = (this->elementInterfaces).ptr;
    uVar10 = uVar1 & 0x7fffffff;
    local_c8._0_4_ = fVar12 - pLVar3[uVar10].thickness;
    local_8c = pLVar3[uVar10].curvatureRadius;
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_50.z = 0.0;
    if ((local_8c != 0.0) || (NAN(local_8c))) {
      bVar5 = IntersectSphericalElement
                        (local_8c,(float)local_c8._0_4_ + local_8c,&local_78,&t,
                         (Normal3f *)&local_50);
      if (!bVar5) goto LAB_003c4569;
    }
    else {
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar11 = vxorps_avx512vl(ZEXT416((uint)(local_78.o.super_Tuple3<pbrt::Point3,_float>.z -
                                              (float)local_c8._0_4_)),auVar4);
      t = auVar11._0_4_ / local_78.d.super_Tuple3<pbrt::Vector3,_float>.z;
    }
    _va = CONCAT44(fStack_ac,t);
    _vb = _vb & 0xffffffff00000000;
    if (t < 0.0) {
      LogFatal<char_const(&)[2],char_const(&)[2],char_const(&)[2],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
                 ,0x463,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [2])0x430e88,
                 (char (*) [2])0x2cf1ae5,(char (*) [2])0x430e88,&va,(char (*) [2])0x2cf1ae5,&vb);
    }
    dVar19 = (double)local_78.o.super_Tuple3<pbrt::Point3,_float>.z;
    local_98 = (double)local_78.o.super_Tuple3<pbrt::Point3,_float>.x;
    PVar21 = Ray::operator()(&local_78,t);
    local_a0 = (double)PVar21.super_Tuple3<pbrt::Point3,_float>.z;
    PVar21 = Ray::operator()(&local_78,t);
    printf(", Line[{{%f, %f}, {%f, %f}}]",dVar19,local_98,local_a0,
           (double)PVar21.super_Tuple3<pbrt::Point3,_float>.x);
    auVar18 = (undefined1  [56])0x0;
    PVar21 = Ray::operator()(&local_78,t);
    auVar16._0_8_ = PVar21.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar16._8_56_ = auVar18;
    auVar13 = auVar16._0_16_;
    auVar20._0_4_ =
         PVar21.super_Tuple3<pbrt::Point3,_float>.x * PVar21.super_Tuple3<pbrt::Point3,_float>.x;
    auVar20._4_4_ =
         PVar21.super_Tuple3<pbrt::Point3,_float>.y * PVar21.super_Tuple3<pbrt::Point3,_float>.y;
    auVar20._8_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar20._12_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar11 = vmovshdup_avx(auVar20);
    auVar11 = vfmadd231ss_fma(auVar11,auVar13,auVar13);
    if (pLVar3[uVar10].apertureRadius * pLVar3[uVar10].apertureRadius < auVar11._0_4_)
    goto LAB_003c4569;
    local_78.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar13);
    local_78.o.super_Tuple3<pbrt::Point3,_float>.z = PVar21.super_Tuple3<pbrt::Point3,_float>.z;
    if ((local_8c != 0.0) || (NAN(local_8c))) {
      _va = 0;
      local_a8 = 0.0;
      fVar12 = 1.0;
      if (uVar7 != 1) {
        fVar2 = (this->elementInterfaces).ptr[uVar7 - 2].eta;
        if ((fVar2 != 0.0) || (fVar12 = 1.0, NAN(fVar2))) {
          fVar12 = fVar2;
        }
      }
      fVar12 = fVar12 / pLVar3[uVar10].eta;
      local_40.z = -local_78.d.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar14._0_8_ = local_78.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
      auVar14._8_4_ = 0x80000000;
      auVar14._12_4_ = 0x80000000;
      auVar18 = ZEXT856(auVar14._8_8_);
      local_40._0_8_ = vmovlps_avx(auVar14);
      VVar22 = Normalize<float>((Vector3<float> *)&local_40);
      local_80 = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar15._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar15._8_56_ = auVar18;
      _vb = vmovlps_avx(auVar15._0_16_);
      auVar16 = ZEXT464((uint)fVar12);
      bVar5 = Refract((Vector3f *)&vb,(Normal3f *)&local_50,fVar12,(Vector3f *)&va);
      if (!bVar5) goto LAB_003c4569;
      local_78.d.super_Tuple3<pbrt::Vector3,_float>.z = local_a8;
      local_78.d.super_Tuple3<pbrt::Vector3,_float>.x = va;
      local_78.d.super_Tuple3<pbrt::Vector3,_float>.y = fStack_ac;
    }
    uVar7 = uVar1;
    fVar12 = (float)local_c8._0_4_;
  }
  local_c8._0_4_ = fVar12;
  VVar22 = Normalize<float>(&local_78.d);
  local_78.d.super_Tuple3<pbrt::Vector3,_float>.z = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar18;
  local_78.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar17._0_16_);
  cVar8 = (char)local_90;
  if (cVar8 == '\0') {
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    local_c8 = vandps_avx512vl(ZEXT416((uint)((float)local_c8._0_4_ * 0.25)),auVar11);
  }
  else {
    auVar13._8_4_ = 0x80000000;
    auVar13._0_8_ = 0x8000000080000000;
    auVar13._12_4_ = 0x80000000;
    auVar11 = vxorps_avx512vl(ZEXT416((uint)local_78.o.super_Tuple3<pbrt::Point3,_float>.x),auVar13)
    ;
    local_c8._0_4_ = auVar11._0_4_ / VVar22.super_Tuple3<pbrt::Vector3,_float>.x;
    local_c8._4_12_ = auVar11._4_12_;
    PVar21 = Ray::operator()(&local_78,(Float)local_c8._0_4_);
    PVar23 = Ray::operator()(&local_78,(Float)local_c8._0_4_);
    printf(", Point[{%f, %f}]",(double)PVar21.super_Tuple3<pbrt::Point3,_float>.z,
           (double)PVar23.super_Tuple3<pbrt::Point3,_float>.x);
  }
  dVar19 = (double)local_78.o.super_Tuple3<pbrt::Point3,_float>.z;
  pcVar9 = "Line";
  if ((char)local_cc != '\0') {
    pcVar9 = "Arrow";
  }
  local_98 = (double)local_78.o.super_Tuple3<pbrt::Point3,_float>.x;
  PVar21 = Ray::operator()(&local_78,(Float)local_c8._0_4_);
  local_a0 = (double)PVar21.super_Tuple3<pbrt::Point3,_float>.z;
  PVar21 = Ray::operator()(&local_78,(Float)local_c8._0_4_);
  printf(", %s[{{%f, %f}, {%f, %f}}]",dVar19,local_98,local_a0,
         (double)PVar21.super_Tuple3<pbrt::Point3,_float>.x,pcVar9);
  if (cVar8 != '\0') {
    dVar19 = (double)local_78.o.super_Tuple3<pbrt::Point3,_float>.z;
    PVar21 = Ray::operator()(&local_78,(Float)local_c8._0_4_);
    printf(", Line[{{%f, 0}, {%f, 0}}]",dVar19,
           (double)(PVar21.super_Tuple3<pbrt::Point3,_float>.z * 1.05));
  }
LAB_003c4569:
  putchar(0x7d);
  return;
}

Assistant:

void RealisticCamera::DrawRayPathFromFilm(const Ray &r, bool arrow,
                                          bool toOpticalIntercept) const {
    Float elementZ = 0;
    // Transform _ray_ from camera to lens system space
    static const Transform LensFromCamera = Scale(1, 1, -1);
    Ray ray = LensFromCamera(r);
    printf("{ ");
    if (TraceLensesFromFilm(r, nullptr) == 0) {
        printf("Dashed, RGBColor[.8, .5, .5]");
    } else
        printf("RGBColor[.5, .5, .8]");

    for (int i = elementInterfaces.size() - 1; i >= 0; --i) {
        const LensElementInterface &element = elementInterfaces[i];
        elementZ -= element.thickness;
        bool isStop = (element.curvatureRadius == 0);
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        if (isStop)
            t = -(ray.o.z - elementZ) / ray.d.z;
        else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, ray, &t, &n))
                goto done;
        }
        CHECK_GE(t, 0);

        printf(", Line[{{%f, %f}, {%f, %f}}]", ray.o.z, ray.o.x, ray(t).z, ray(t).x);

        // Test intersection point against element aperture
        Point3f pHit = ray(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        Float apertureRadius2 = element.apertureRadius * element.apertureRadius;
        if (r2 > apertureRadius2)
            goto done;
        ray.o = pHit;

        // Update ray path for element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = element.eta;
            Float eta_t = (i > 0 && elementInterfaces[i - 1].eta != 0)
                              ? elementInterfaces[i - 1].eta
                              : 1;
            if (!Refract(Normalize(-ray.d), n, eta_t / eta_i, &wt))
                goto done;
            ray.d = wt;
        }
    }

    ray.d = Normalize(ray.d);
    {
        Float ta = std::abs(elementZ / 4);
        if (toOpticalIntercept) {
            ta = -ray.o.x / ray.d.x;
            printf(", Point[{%f, %f}]", ray(ta).z, ray(ta).x);
        }
        printf(", %s[{{%f, %f}, {%f, %f}}]", arrow ? "Arrow" : "Line", ray.o.z, ray.o.x,
               ray(ta).z, ray(ta).x);

        // overdraw the optical axis if needed...
        if (toOpticalIntercept)
            printf(", Line[{{%f, 0}, {%f, 0}}]", ray.o.z, ray(ta).z * 1.05f);
    }

done:
    printf("}");
}